

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O3

Status __thiscall leveldb::DBImpl::LoadRange(DBImpl *this,string *fname,string *start,string *end)

{
  _func_int **pp_Var1;
  Table *pTVar2;
  DBImpl *pDVar3;
  int iVar4;
  Iterator *pIVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ulong in_R8;
  Comparator *pCVar6;
  Table *table;
  RandomAccessFile *file;
  uint64_t file_size;
  WriteBatch batch;
  Options options;
  Table *local_108;
  RandomAccessFile *local_100;
  DBImpl *local_f8;
  string *local_f0;
  Slice local_e8;
  Slice local_d8;
  uint64_t local_c8;
  WriteBatch local_c0;
  Options local_a0;
  ReadOptions local_40;
  
  (this->super_DB)._vptr_DB = (_func_int **)0x0;
  local_100 = (RandomAccessFile *)0x0;
  local_108 = (Table *)0x0;
  local_f0 = fname;
  (**(code **)(*(long *)fname->_M_string_length + 0x58))
            (&local_a0,(long *)fname->_M_string_length,start,&local_c8);
  (this->super_DB)._vptr_DB = (_func_int **)local_a0.comparator;
  pCVar6 = local_a0.comparator;
  if (local_a0.comparator == (Comparator *)0x0) {
    (**(code **)(*(long *)local_f0->_M_string_length + 0x18))
              (&local_a0,(long *)local_f0->_M_string_length,start,&local_100);
    (this->super_DB)._vptr_DB = (_func_int **)local_a0.comparator;
    pCVar6 = local_a0.comparator;
  }
  Options::Options(&local_a0);
  local_a0.filter_policy = (FilterPolicy *)0x0;
  local_a0.compression = kSnappyCompression;
  if (pCVar6 == (Comparator *)0x0) {
    Table::Open((Table *)&local_c0,&local_a0,local_100,local_c8,&local_108);
    (this->super_DB)._vptr_DB = (_func_int **)local_c0.rep_._M_dataplus._M_p;
    if ((_func_int **)local_c0.rep_._M_dataplus._M_p == (_func_int **)0x0) {
      local_40.verify_checksums = false;
      local_40.fill_cache = true;
      local_40.snapshot = (Snapshot *)0x0;
      pIVar5 = Table::NewIterator(local_108,&local_40);
      WriteBatch::WriteBatch(&local_c0);
      local_f8 = this;
      (*pIVar5->_vptr_Iterator[3])(pIVar5);
      iVar4 = (*pIVar5->_vptr_Iterator[8])(pIVar5);
      (*pIVar5->_vptr_Iterator[8])(pIVar5);
      std::__cxx11::string::_M_replace
                ((ulong)end,0,(char *)end->_M_string_length,CONCAT44(extraout_var,iVar4));
      while (iVar4 = (*pIVar5->_vptr_Iterator[2])(pIVar5), (char)iVar4 != '\0') {
        iVar4 = (*pIVar5->_vptr_Iterator[8])(pIVar5);
        (*pIVar5->_vptr_Iterator[8])(pIVar5);
        std::__cxx11::string::_M_replace
                  (in_R8,0,*(char **)(in_R8 + 8),CONCAT44(extraout_var_00,iVar4));
        iVar4 = (*pIVar5->_vptr_Iterator[8])(pIVar5);
        local_e8.data_ = (char *)CONCAT44(extraout_var_01,iVar4);
        iVar4 = (*pIVar5->_vptr_Iterator[9])(pIVar5);
        local_d8.data_ = (char *)CONCAT44(extraout_var_02,iVar4);
        WriteBatch::Put(&local_c0,&local_e8,&local_d8);
        (*pIVar5->_vptr_Iterator[6])(pIVar5);
      }
      local_d8.data_ = (char *)((ulong)local_d8.data_ & 0xffffffffffffff00);
      (**(code **)((local_f0->_M_dataplus)._M_p + 0x20))(&local_e8,local_f0,&local_d8,&local_c0);
      pDVar3 = local_f8;
      pp_Var1 = (local_f8->super_DB)._vptr_DB;
      (local_f8->super_DB)._vptr_DB = (_func_int **)local_e8.data_;
      local_e8.data_ = (char *)pp_Var1;
      if (pp_Var1 != (_func_int **)0x0) {
        operator_delete__(pp_Var1);
      }
      (*pIVar5->_vptr_Iterator[1])(pIVar5);
      pTVar2 = local_108;
      if (local_108 != (Table *)0x0) {
        Table::~Table(local_108);
      }
      operator_delete(pTVar2);
      if (local_100 != (RandomAccessFile *)0x0) {
        (*local_100->_vptr_RandomAccessFile[1])();
      }
      WriteBatch::~WriteBatch(&local_c0);
      return (Status)(char *)pDVar3;
    }
  }
  pTVar2 = local_108;
  if (local_108 != (Table *)0x0) {
    Table::~Table(local_108);
  }
  operator_delete(pTVar2);
  if (local_100 != (RandomAccessFile *)0x0) {
    (*local_100->_vptr_RandomAccessFile[1])();
  }
  return (Status)(char *)this;
}

Assistant:

Status DBImpl::LoadRange(const std::string& fname,
                   std::string* start, 
                   std::string* end){
  Status s;
  uint64_t file_size;
  RandomAccessFile* file = nullptr;
  Table* table = nullptr;

  s = env_->GetFileSize(fname, &file_size);
  if (s.ok()) {
    s = env_->NewRandomAccessFile(fname, &file);
  }

  Options options;
  options.filter_policy = nullptr;
  options.compression = kSnappyCompression;
  if (s.ok()) {
    s = Table::Open(options, file, file_size, &table);
  }

  if (!s.ok()) {
    delete table;
    delete file;
    return s;
  }

  ReadOptions readoptions;
  readoptions.fill_cache = true;
  Iterator* iter = table->NewIterator(readoptions);
  WriteBatch batch;
  //printf("START LOADING...");
  iter->SeekToFirst();
  start->assign(iter->key().data(), iter->key().size());
  for (; iter->Valid(); iter->Next()) {
    end->assign(iter->key().data(), iter->key().size());
    //printf("LOAD Key: [%s], value: [%s]\n", iter->key().ToString().c_str(), iter->value().ToString().c_str());
    batch.Put(iter->key(), iter->value());
  }
  s = Write(WriteOptions(), &batch);
  
  delete iter;
  delete table;
  delete file;
  return s;
}